

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O1

void __thiscall
iDynTree::BerdySparseMAPSolver::updateEstimateInformationFloatingBase
          (BerdySparseMAPSolver *this,JointPosDoubleArray *jointsConfiguration,
          JointDOFsDoubleArray *jointsVelocity,FrameIndex floatingFrame,
          Vector3 *bodyAngularVelocityOfSpecifiedFrame,VectorDynSize *measurements)

{
  BerdySparseMAPSolverPimpl *pBVar1;
  FrameIndex local_38;
  
  local_38 = floatingFrame;
  iDynTree::VectorDynSize::operator=
            ((VectorDynSize *)&this->m_pimpl->jointsConfiguration,
             (VectorDynSize *)jointsConfiguration);
  iDynTree::VectorDynSize::operator=
            ((VectorDynSize *)&this->m_pimpl->jointsVelocity,(VectorDynSize *)jointsVelocity);
  iDynTree::VectorDynSize::operator=(&this->m_pimpl->measurements,measurements);
  pBVar1 = this->m_pimpl;
  BerdyHelper::updateKinematicsFromFloatingBase
            (pBVar1->berdy,&pBVar1->jointsConfiguration,&pBVar1->jointsVelocity,&local_38,
             bodyAngularVelocityOfSpecifiedFrame);
  return;
}

Assistant:

void BerdySparseMAPSolver::updateEstimateInformationFloatingBase(const iDynTree::JointPosDoubleArray& jointsConfiguration,
                                                                     const iDynTree::JointDOFsDoubleArray& jointsVelocity,
                                                                     const FrameIndex floatingFrame,
                                                                     const Vector3& bodyAngularVelocityOfSpecifiedFrame,
                                                                     const iDynTree::VectorDynSize& measurements)
    {
        assert(m_pimpl);

        m_pimpl->jointsConfiguration = jointsConfiguration;
        m_pimpl->jointsVelocity = jointsVelocity;
        m_pimpl->measurements = measurements;

        m_pimpl->berdy.updateKinematicsFromFloatingBase(m_pimpl->jointsConfiguration, m_pimpl->jointsVelocity,
                                                        floatingFrame, bodyAngularVelocityOfSpecifiedFrame);
    }